

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::AddDeprecatedFlag
          (FieldGeneratorBase *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  Type TVar3;
  FieldOptions *this_00;
  Descriptor *this_01;
  MessageOptions *this_02;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  FieldGeneratorBase *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  this_00 = FieldDescriptor::options(this->descriptor_);
  bVar2 = FieldOptions::deprecated(this_00);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"[global::System.ObsoleteAttribute]\n");
    io::Printer::Print<>(pPVar1,local_28);
  }
  else {
    TVar3 = FieldDescriptor::type(this->descriptor_);
    if (TVar3 == TYPE_MESSAGE) {
      this_01 = FieldDescriptor::message_type(this->descriptor_);
      this_02 = Descriptor::options(this_01);
      bVar2 = MessageOptions::deprecated(this_02);
      pPVar1 = local_18;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_38,"[global::System.ObsoleteAttribute]\n");
        io::Printer::Print<>(pPVar1,local_38);
      }
    }
  }
  return;
}

Assistant:

void FieldGeneratorBase::AddDeprecatedFlag(io::Printer* printer) {
  if (descriptor_->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  } else if (descriptor_->type() == FieldDescriptor::TYPE_MESSAGE &&
           descriptor_->message_type()->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  }
}